

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O0

token_code get_token_code(string *token)

{
  bool bVar1;
  string *token_local;
  
  bVar1 = std::operator==(token,"-ka");
  if (bVar1) {
    token_local._4_4_ = ambient;
  }
  else {
    bVar1 = std::operator==(token,"-kd");
    if (bVar1) {
      token_local._4_4_ = diffuse;
    }
    else {
      bVar1 = std::operator==(token,"-ks");
      if (bVar1) {
        token_local._4_4_ = specular;
      }
      else {
        bVar1 = std::operator==(token,"-spu");
        if (bVar1) {
          token_local._4_4_ = set_pu;
        }
        else {
          bVar1 = std::operator==(token,"-spv");
          if (bVar1) {
            token_local._4_4_ = set_pv;
          }
          else {
            bVar1 = std::operator==(token,"-sp");
            if (bVar1) {
              token_local._4_4_ = set_p;
            }
            else {
              bVar1 = std::operator==(token,"-dl");
              if (bVar1) {
                token_local._4_4_ = add_dl;
              }
              else {
                bVar1 = std::operator==(token,"-pl");
                if (bVar1) {
                  token_local._4_4_ = add_pl;
                }
                else {
                  bVar1 = std::operator==(token,"-toon");
                  if (bVar1) {
                    token_local._4_4_ = toon;
                  }
                  else {
                    bVar1 = std::operator==(token,"-toonl");
                    if (bVar1) {
                      token_local._4_4_ = set_toon_layers;
                    }
                    else {
                      bVar1 = std::operator==(token,"-transludepth");
                      if (bVar1) {
                        token_local._4_4_ = set_depth;
                      }
                      else {
                        bVar1 = std::operator==(token,"-transludd");
                        if (bVar1) {
                          token_local._4_4_ = set_dd;
                        }
                        else {
                          bVar1 = std::operator==(token,"-transluds");
                          if (bVar1) {
                            token_local._4_4_ = set_ds;
                          }
                          else {
                            bVar1 = std::operator==(token,"-sketch");
                            if (bVar1) {
                              token_local._4_4_ = set_sketch;
                            }
                            else {
                              token_local._4_4_ = not_specified;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return token_local._4_4_;
}

Assistant:

token_code get_token_code(string const& token){
    if (token == "-ka") return ambient;
    if (token == "-kd") return diffuse;
    if (token == "-ks") return specular;
    if (token == "-spu") return set_pu;
    if (token == "-spv") return set_pv;
    if (token == "-sp") return set_p;
    if (token == "-dl") return add_dl;
    if (token == "-pl") return add_pl;
    if (token == "-toon") return toon;
    if (token == "-toonl") return set_toon_layers;
    if (token == "-transludepth") return set_depth;
    if (token == "-transludd") return set_dd;
    if (token == "-transluds") return set_ds;
    if (token == "-sketch") return set_sketch;
    return not_specified;
}